

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateColsPS::DuplicateColsPS
          (DuplicateColsPS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,int _j,int _k,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *scale,DataArray<int> *perm,shared_ptr<soplex::Tolerances> *tols,bool isFirst,
          bool isTheLast)

{
  DataArray<int> *old;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 *in_RDI;
  byte in_stack_00000010;
  byte in_stack_00000018;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffef0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  undefined8 in_stack_fffffffffffffef8;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffff00;
  DataArray<int> *this_01;
  char *in_stack_ffffffffffffff08;
  PostStep *in_stack_ffffffffffffff10;
  
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffef0,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x444b47);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x444b5a);
  PostStep::PostStep(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                     (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),(int)in_stack_fffffffffffffef8)
  ;
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x444b91);
  *in_RDI = &PTR__DuplicateColsPS_004f1110;
  *(undefined4 *)(in_RDI + 5) = in_EDX;
  *(undefined4 *)((long)in_RDI + 0x2c) = in_ECX;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::lower(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffef0,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::upper(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffef0,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  this_01 = (DataArray<int> *)(in_RDI + 0x14);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::lower(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffef0,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  this_00 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)(in_RDI + 0x1b);
  old = (DataArray<int> *)
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::upper(this_00,in_stack_fffffffffffffeec);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)this_00,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)this_00,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  *(byte *)(in_RDI + 0x29) = in_stack_00000010 & 1;
  *(byte *)((long)in_RDI + 0x149) = in_stack_00000018 & 1;
  DataArray<int>::DataArray(this_01,old);
  return;
}

Assistant:

DuplicateColsPS(const SPxLPBase<R>& lp, int _j, int _k, R scale, DataArray<int>  perm,
                      std::shared_ptr<Tolerances> tols, bool isFirst = false, bool isTheLast = false)
         : PostStep("DuplicateCols", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_k(_k)
         , m_loJ(lp.lower(_j))
         , m_upJ(lp.upper(_j))
         , m_loK(lp.lower(_k))
         , m_upK(lp.upper(_k))
         , m_scale(scale)
         , m_isFirst(isFirst)
         , m_isLast(isTheLast)
         , m_perm(perm)
      {}